

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void C_SetCVarsToDefaults(void)

{
  FBaseCVar *this;
  undefined8 in_RAX;
  UCVarValue value;
  FBaseCVar **ppFVar1;
  ECVarType type;
  undefined8 uStack_18;
  undefined4 extraout_var;
  
  ppFVar1 = &CVars;
  uStack_18 = in_RAX;
  while (this = *ppFVar1, this != (FBaseCVar *)0x0) {
    if ((this->Flags & 1) != 0) {
      value._0_4_ = (*this->_vptr_FBaseCVar[7])(this,(long)&uStack_18 + 4);
      value._4_4_ = extraout_var;
      FBaseCVar::SetGenericRep(this,value,uStack_18._4_4_);
    }
    ppFVar1 = &this->m_Next;
  }
  return;
}

Assistant:

void C_SetCVarsToDefaults (void)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		// Only default save-able cvars
		if (cvar->Flags & CVAR_ARCHIVE)
		{
			UCVarValue val;
			ECVarType type;
			val = cvar->GetFavoriteRepDefault (&type);
			cvar->SetGenericRep (val, type);
		}
		cvar = cvar->m_Next;
	}
}